

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractstringserialiser.cpp
# Opt level: O2

QVariant * __thiscall
AbstractStringSerialiserPrivate::stringToVariant
          (QVariant *__return_storage_ptr__,AbstractStringSerialiserPrivate *this,QString *val)

{
  Data *pDVar1;
  char *pcVar2;
  qsizetype qVar3;
  QDataStream inStream;
  QArrayDataPointer<char> local_58;
  Version local_40;
  QArrayDataPointer<char> local_38;
  
  QString::toLatin1_helper((QString *)&local_58);
  QByteArray::fromBase64(&local_38,&local_58,0);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  qUncompress((QByteArray *)&local_58,(QByteArray *)&local_38);
  qVar3 = local_38.size;
  pcVar2 = local_38.ptr;
  pDVar1 = local_38.d;
  local_38.d = local_58.d;
  local_38.ptr = local_58.ptr;
  local_58.d = pDVar1;
  local_58.ptr = pcVar2;
  local_38.size = local_58.size;
  local_58.size = qVar3;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  QDataStream::QDataStream((QDataStream *)&local_58,(QByteArray *)&local_38);
  local_40 = (this->super_AbstractModelSerialiserPrivate).m_streamVersion;
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  ::operator>>((QDataStream *)&local_58,__return_storage_ptr__);
  QDataStream::~QDataStream((QDataStream *)&local_58);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
  return __return_storage_ptr__;
}

Assistant:

QVariant AbstractStringSerialiserPrivate::stringToVariant(const QString &val) const
{
    QByteArray data = QByteArray::fromBase64(val.toLatin1());
    data = qUncompress(data);
    QDataStream inStream(data);
    inStream.setVersion(m_streamVersion);
    QVariant result;
    inStream >> result;
    return result;
}